

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O2

int Sim_SymmsIsCompatibleWithNodes(Abc_Ntk_t *pNtk,uint uSymm,Vec_Ptr_t *vNodesOther,int *pMap)

{
  void *pvVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = vNodesOther->nSize;
  if (uVar3 == 0) {
    return 1;
  }
  uVar4 = 0;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  do {
    if (uVar4 == uVar5) {
      return 1;
    }
    uVar7 = (ulong)vNodesOther->pArray[uVar4] & 0xfffffffffffffffe;
    pvVar1 = pNtk->vSupps->pArray[*(int *)(uVar7 + 0x10)];
    uVar3 = *(uint *)((long)pvVar1 + (ulong)(uSymm >> 5 & 0x7ff) * 4) & 1 << ((byte)uSymm & 0x1f);
    uVar8 = *(uint *)((long)pvVar1 + (ulong)(uSymm >> 0x15) * 4) &
            1 << ((byte)(uSymm >> 0x10) & 0x1f);
    if (uVar3 != 0 || uVar8 != 0) {
      if ((uVar3 != 0) != (uVar8 != 0)) {
        return 0;
      }
      lVar2 = *(long *)(uVar7 + 0x40);
      uVar3 = *(uint *)(lVar2 + 4);
      uVar7 = 0;
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        if (*(uint *)(*(long *)(lVar2 + 8) + uVar6 * 4) == uSymm) {
          uVar7 = uVar6 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar7 == uVar3) {
        return 0;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Sim_SymmsIsCompatibleWithNodes( Abc_Ntk_t * pNtk, unsigned uSymm, Vec_Ptr_t * vNodesOther, int * pMap )
{
    Vec_Int_t * vSymmsNode;
    Abc_Obj_t * pNode;
    int i, s, Ind1, Ind2, fIsVar1, fIsVar2;

    if ( vNodesOther->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the nodes
    // if they do not belong to a support, it is okay
    // if one belongs, the other does not belong, quit
    // if they belong, but are not part of symmetry, quit
    for ( i = 0; i < vNodesOther->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[i]);
        fIsVar1 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind1 );
        fIsVar2 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind2 );

        if ( !fIsVar1 && !fIsVar2 )
            continue;
        if ( fIsVar1 ^ fIsVar2 )
            return 0;
        // both belong
        // check if there is a symmetry
        vSymmsNode = SIM_READ_SYMMS( pNode );
        for ( s = 0; s < vSymmsNode->nSize; s++ )
            if ( uSymm == (unsigned)vSymmsNode->pArray[s] )
                break;
        if ( s == vSymmsNode->nSize )
            return 0;
    }
    return 1;
}